

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTransformFeedbackOverflowQueryTests.cpp
# Opt level: O0

IterateResult __thiscall
gl3cts::TransformFeedbackOverflowQueryErrorInvalidIndex::iterate
          (TransformFeedbackOverflowQueryErrorInvalidIndex *this)

{
  bool bVar1;
  int iVar2;
  GLuint GVar3;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  uint local_2c;
  uint local_28;
  GLuint i_3;
  GLuint i_2;
  GLuint i_1;
  GLuint i;
  GLint value;
  Functions *gl;
  TransformFeedbackOverflowQueryErrorInvalidIndex *this_local;
  
  gl = (Functions *)this;
  pRVar4 = deqp::Context::getRenderContext
                     ((this->super_TransformFeedbackOverflowQueryErrorBase).
                      super_TransformFeedbackOverflowQueryBaseTest.super_TestCase.m_context);
  iVar2 = (*pRVar4->_vptr_RenderContext[3])();
  _i = CONCAT44(extraout_var,iVar2);
  TransformFeedbackOverflowQueryErrorBase::startTest
            (&this->super_TransformFeedbackOverflowQueryErrorBase,
             "GetQueryIndexediv must generate INVALID_VALUE if <target> is TRANSFORM_FEEDBACK_OVERFLOW_ARB and <index> is non-zero."
            );
  for (i_2 = 1; GVar3 = TransformFeedbackOverflowQueryBaseTest::getMaxVertexStreams
                                  ((TransformFeedbackOverflowQueryBaseTest *)this), i_2 < GVar3;
      i_2 = i_2 + 1) {
    (**(code **)(_i + 0xa00))(0x82ec,i_2,0x8865,&i_1);
    TransformFeedbackOverflowQueryErrorBase::verifyError
              (&this->super_TransformFeedbackOverflowQueryErrorBase,0x501);
  }
  bVar1 = TransformFeedbackOverflowQueryBaseTest::supportsTransformFeedback3
                    ((TransformFeedbackOverflowQueryBaseTest *)this);
  if (bVar1) {
    TransformFeedbackOverflowQueryErrorBase::startTest
              (&this->super_TransformFeedbackOverflowQueryErrorBase,
               "GetQueryIndexediv must generate INVALID_VALUE if <target> is TRANSFORM_FEEDBACK_STREAM_OVERFLOW_ARB and <index> is greater than or equal to MAX_VERTEX_STREAMS."
              );
    for (i_3 = TransformFeedbackOverflowQueryBaseTest::getMaxVertexStreams
                         ((TransformFeedbackOverflowQueryBaseTest *)this);
        GVar3 = TransformFeedbackOverflowQueryBaseTest::getMaxVertexStreams
                          ((TransformFeedbackOverflowQueryBaseTest *)this), i_3 < GVar3 + 4;
        i_3 = i_3 + 1) {
      (**(code **)(_i + 0xa00))(0x82ed,i_3,0x8865,&i_1);
      TransformFeedbackOverflowQueryErrorBase::verifyError
                (&this->super_TransformFeedbackOverflowQueryErrorBase,0x501);
    }
  }
  TransformFeedbackOverflowQueryErrorBase::startTest
            (&this->super_TransformFeedbackOverflowQueryErrorBase,
             "BeginQueryIndexed must generate INVALID_VALUE if <target> is TRANSFORM_FEEDBACK_OVERFLOW_ARB and <index> is non-zero."
            );
  for (local_28 = 1;
      GVar3 = TransformFeedbackOverflowQueryBaseTest::getMaxVertexStreams
                        ((TransformFeedbackOverflowQueryBaseTest *)this), local_28 < GVar3;
      local_28 = local_28 + 1) {
    (**(code **)(_i + 0x28))(0x82ec,local_28,this->m_query);
    TransformFeedbackOverflowQueryErrorBase::verifyError
              (&this->super_TransformFeedbackOverflowQueryErrorBase,0x501);
  }
  bVar1 = TransformFeedbackOverflowQueryBaseTest::supportsTransformFeedback3
                    ((TransformFeedbackOverflowQueryBaseTest *)this);
  if (bVar1) {
    TransformFeedbackOverflowQueryErrorBase::startTest
              (&this->super_TransformFeedbackOverflowQueryErrorBase,
               "BeginQueryIndexed must generate INVALID_VALUE if <target> is TRANSFORM_FEEDBACK_STREAM_OVERFLOW_ARB and <index> is greater than or equal to MAX_VERTEX_STREAMS."
              );
    for (local_2c = TransformFeedbackOverflowQueryBaseTest::getMaxVertexStreams
                              ((TransformFeedbackOverflowQueryBaseTest *)this);
        GVar3 = TransformFeedbackOverflowQueryBaseTest::getMaxVertexStreams
                          ((TransformFeedbackOverflowQueryBaseTest *)this), local_2c < GVar3 + 4;
        local_2c = local_2c + 1) {
      (**(code **)(_i + 0x28))(0x82ed,local_2c,this->m_query);
      TransformFeedbackOverflowQueryErrorBase::verifyError
                (&this->super_TransformFeedbackOverflowQueryErrorBase,0x501);
    }
  }
  tcu::TestContext::setTestResult
            ((this->super_TransformFeedbackOverflowQueryErrorBase).
             super_TransformFeedbackOverflowQueryBaseTest.super_TestCase.super_TestCase.
             super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,"Pass");
  return STOP;
}

Assistant:

IterateResult iterate()
	{
		const glw::Functions& gl = m_context.getRenderContext().getFunctions();
		GLint				  value;

		startTest("GetQueryIndexediv must generate INVALID_VALUE if <target> is "
				  "TRANSFORM_FEEDBACK_OVERFLOW_ARB and <index> is non-zero.");

		for (GLuint i = 1; i < getMaxVertexStreams(); ++i)
		{
			gl.getQueryIndexediv(GL_TRANSFORM_FEEDBACK_OVERFLOW_ARB, i, GL_CURRENT_QUERY, &value);
			verifyError(GL_INVALID_VALUE);
		}

		if (supportsTransformFeedback3())
		{
			startTest("GetQueryIndexediv must generate INVALID_VALUE if <target> is "
					  "TRANSFORM_FEEDBACK_STREAM_OVERFLOW_ARB and <index> is greater "
					  "than or equal to MAX_VERTEX_STREAMS.");

			for (GLuint i = getMaxVertexStreams(); i < getMaxVertexStreams() + 4; ++i)
			{
				gl.getQueryIndexediv(GL_TRANSFORM_FEEDBACK_STREAM_OVERFLOW_ARB, i, GL_CURRENT_QUERY, &value);
				verifyError(GL_INVALID_VALUE);
			}
		}

		startTest("BeginQueryIndexed must generate INVALID_VALUE if <target> is "
				  "TRANSFORM_FEEDBACK_OVERFLOW_ARB and <index> is non-zero.");

		for (GLuint i = 1; i < getMaxVertexStreams(); ++i)
		{
			gl.beginQueryIndexed(GL_TRANSFORM_FEEDBACK_OVERFLOW_ARB, i, m_query);
			verifyError(GL_INVALID_VALUE);
		}

		if (supportsTransformFeedback3())
		{
			startTest("BeginQueryIndexed must generate INVALID_VALUE if <target> is "
					  "TRANSFORM_FEEDBACK_STREAM_OVERFLOW_ARB and <index> is greater "
					  "than or equal to MAX_VERTEX_STREAMS.");

			for (GLuint i = getMaxVertexStreams(); i < getMaxVertexStreams() + 4; ++i)
			{
				gl.beginQueryIndexed(GL_TRANSFORM_FEEDBACK_STREAM_OVERFLOW_ARB, i, m_query);
				verifyError(GL_INVALID_VALUE);
			}
		}

		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

		return STOP;
	}